

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O2

void __thiscall VarnodeBank::replace(VarnodeBank *this,Varnode *oldvn,Varnode *newvn)

{
  const_iterator cVar1;
  PcodeOp *this_00;
  int4 iVar2;
  _Self __tmp;
  const_iterator __position;
  
  cVar1._M_node =
       (oldvn->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
       super__List_node_base._M_next;
  while (__position._M_node = cVar1._M_node,
        __position._M_node != (_List_node_base *)&oldvn->descend) {
    cVar1._M_node = (__position._M_node)->_M_next;
    this_00 = (PcodeOp *)__position._M_node[1]._M_next;
    if (this_00->output != newvn) {
      iVar2 = PcodeOp::getSlot(this_00,oldvn);
      std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::erase(&oldvn->descend,__position);
      (this_00->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
      super__Vector_impl_data._M_start[iVar2] = (Varnode *)0x0;
      Varnode::addDescend(newvn,this_00);
      (this_00->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
      super__Vector_impl_data._M_start[iVar2] = newvn;
    }
  }
  Varnode::setFlags(oldvn,0x2000000);
  Varnode::setFlags(newvn,0x2000000);
  return;
}

Assistant:

void VarnodeBank::replace(Varnode *oldvn,Varnode *newvn)

{
  list<PcodeOp *>::iterator iter,tmpiter;
  PcodeOp *op;
  int4 i;

  iter = oldvn->descend.begin();
  while(iter!=oldvn->descend.end()) {
    op = *iter;
    tmpiter = iter++;
    if (op->output == newvn) continue; // Cannot be input to your own definition
    i = op->getSlot(oldvn);
    oldvn->descend.erase(tmpiter);	// Sever the link fully
    op->clearInput(i); // Before attempting to build the new link
    newvn->addDescend(op);
    op->setInput(newvn,i); // This must be called AFTER descend is updated
  }
  oldvn->setFlags(Varnode::coverdirty);
  newvn->setFlags(Varnode::coverdirty);
}